

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O0

pair<const_char_*const,_ValueType>
UniqueObjectHelper<std::pair<char_const*const,ValueType>>(int index)

{
  ValueType extraout_RDX;
  pair<const_char_*const,_ValueType> *in_RDI;
  pair<const_char_*const,_ValueType> pVar1;
  int in_stack_00000024;
  pair<const_char_*const,_ValueType> *this;
  pair<const_char_*const,_ValueType> *ppVar2;
  
  this = in_RDI;
  ppVar2 = in_RDI;
  UniqueObjectHelper<char*>(in_stack_00000024);
  UniqueObjectHelper<ValueType>((int)((ulong)ppVar2 >> 0x20));
  std::pair<const_char_*const,_ValueType>::pair<char_*,_ValueType,_true>
            (this,&in_RDI->first,(ValueType *)0x10b4be0);
  ValueType::~ValueType((ValueType *)0x10b4bec);
  pVar1.second.s_ = extraout_RDX.s_;
  pVar1.first = (char *)in_RDI;
  return pVar1;
}

Assistant:

pair<const char* const, ValueType> UniqueObjectHelper(int index) {
  return pair<const char* const, ValueType>(
      UniqueObjectHelper<char*>(index),
      UniqueObjectHelper<ValueType>(index + 1));
}